

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_warc.c
# Opt level: O1

void test_read(archive *a,char *buff,size_t used,char *filedata)

{
  int iVar1;
  la_ssize_t v2;
  archive_entry *ae;
  archive_entry *local_38;
  
  iVar1 = archive_read_support_filter_none(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\x1f',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_none(a)",a);
  iVar1 = archive_read_open_memory(a,buff,used);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L' ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",a);
  iVar1 = archive_read_next_header(a,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'\"',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  v2 = archive_read_data(a,filedata,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'#',9,"9",v2,"archive_read_data(a, filedata, 10)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'$',filedata,"filedata","12345678","\"12345678\"",9,"9",(void *)0x0);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'%',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_warc.c"
                      ,L'&',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void test_read(struct archive *a, char *buff, size_t used, char *filedata)
{
	struct archive_entry *ae;
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualIntA(a, 9, archive_read_data(a, filedata, 10));
	assertEqualMem(filedata, "12345678", 9);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}